

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O1

DidChangeTextDocumentParams *
lscpp::experimental::get_params<(lscpp::experimental::method_kind)5>
          (DidChangeTextDocumentParams *__return_storage_ptr__,any *params)

{
  long *plVar1;
  
  plVar1 = (long *)std::__any_caster<lscpp::protocol::DidChangeTextDocumentParams>(params);
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->textDocument).super_TextDocumentIdentifier.uri._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->textDocument).super_TextDocumentIdentifier.uri.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    (__return_storage_ptr__->textDocument).version = (int)plVar1[4];
    std::
    vector<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
    ::vector(&__return_storage_ptr__->contentChanges,
             (vector<lscpp::protocol::TextDocumentContentChangeEvent,_std::allocator<lscpp::protocol::TextDocumentContentChangeEvent>_>
              *)(plVar1 + 5));
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

auto get_params(std::any params) {
  return std::any_cast<to_params_t<Kind>>(params);
}